

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

recursive_directory_iterator ghc::filesystem::begin(recursive_directory_iterator *iter)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  recursive_directory_iterator rVar3;
  
  peVar1 = (iter->_impl).
           super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (iter->_impl).
           super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (iter->_impl).
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)in_RDI = peVar1;
  (in_RDI->_dir_iter_stack).c.
  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)p_Var2;
  (iter->_impl).
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  rVar3._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  rVar3._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (recursive_directory_iterator)
         rVar3._impl.
         super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

GHC_INLINE recursive_directory_iterator begin(recursive_directory_iterator iter) noexcept
{
    return iter;
}